

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O1

ostream * __thiscall Measurement::toString(Measurement *this,ostream *strm)

{
  long lVar1;
  
  if (0 < (this->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows) {
    lVar1 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(strm,"\t",1);
      if ((this->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows <= lVar1) goto LAB_00111fef;
      std::ostream::_M_insert<double>
                ((this->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->estimate_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"\t",1);
  std::ostream::_M_insert<double>(this->nis_);
  if (0 < (this->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows) {
    lVar1 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(strm,"\t",1);
      if ((this->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= lVar1) {
LAB_00111fef:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xad,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      std::ostream::_M_insert<double>
                ((this->ground_truth_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->ground_truth_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"\n",1);
  return strm;
}

Assistant:

std::ostream& Measurement::toString(std::ostream &strm) const {
    // output the estimation
    for (int i=0; i<estimate_.rows(); i++)
        strm << "\t" << estimate_(i);

    strm << "\t" << nis_; // nis

    // output the ground truth packages
    for (int i=0; i<ground_truth_.rows(); i++)
        strm << "\t" << ground_truth_(i);

    strm << "\n";

    return strm;
}